

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

void __thiscall prometheus::Histogram::Observe(Histogram *this,double value)

{
  pointer pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  double local_30;
  
  pdVar1 = (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_30 = value;
  _Var2 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,__gnu_cxx::__ops::_Iter_less_val>
                    (pdVar1,(this->bucket_boundaries_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_30);
  std::mutex::lock(&this->mutex_);
  Gauge::Increment(&this->sum_,local_30);
  Counter::Increment((Counter *)
                     ((long)_Var2._M_current +
                     ((long)(this->bucket_counts_).
                            super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)pdVar1)));
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void Histogram::Observe(const double value) {
  const auto bucket_index = static_cast<std::size_t>(
      std::distance(bucket_boundaries_.begin(),
                    std::lower_bound(bucket_boundaries_.begin(),
                                     bucket_boundaries_.end(), value)));

  std::lock_guard<std::mutex> lock(mutex_);
  sum_.Increment(value);
  bucket_counts_[bucket_index].Increment();
}